

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

PerspectiveCamera * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::PerspectiveCamera,pbrt::CameraBaseParameters&,float&,pbrt::Bounds2<float>&,float&,float&>
          (polymorphic_allocator<std::byte> *this,CameraBaseParameters *args,float *args_1,
          Bounds2<float> *args_2,float *args_3,float *args_4)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0x5a8,8);
  construct<pbrt::PerspectiveCamera,pbrt::CameraBaseParameters&,float&,pbrt::Bounds2<float>&,float&,float&>
            (this,(PerspectiveCamera *)CONCAT44(extraout_var,iVar1),args,args_1,args_2,args_3,args_4
            );
  return (PerspectiveCamera *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }